

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::TextureUploadTests::init(TextureUploadTests *this,EVP_PKEY_CTX *ctx)

{
  UploadFunction uploadFunction;
  deUint32 format;
  deUint32 type;
  int iVar1;
  TestCaseGroup *pTVar2;
  TestNode *node;
  TextureUploadAndDrawCase *this_00;
  long lVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  long lVar5;
  anon_struct_24_3_c311304e *paVar6;
  allocator<char> local_e9;
  TestCaseGroup *local_e8;
  anon_struct_24_3_ccf0331b *local_e0;
  TestCaseGroup *local_d8;
  long local_d0;
  long local_c8;
  anon_struct_24_3_c311304e *local_c0;
  long local_b8;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_e8,(this->super_TestCaseGroup).m_context,"upload","Texture upload");
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"upload_draw_swap",
             "Texture upload, draw & buffer swap");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_e8);
  local_d8 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  if (init()::textureSizes == '\0') {
    iVar1 = __cxa_guard_acquire(&init()::textureSizes);
    if (iVar1 != 0) {
      init::textureSizes[0].size = 0x10;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"16x16","Texture size 16x16");
      init::textureSizes[0].uploadCallGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"16x16","Texture size 16x16");
      init::textureSizes[1].size = 0x100;
      init::textureSizes[0].uploadAndDrawGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"256x256","Texture size 256x256");
      init::textureSizes[1].uploadCallGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"256x256","Texture size 256x256");
      init::textureSizes[2].size = 0x101;
      init::textureSizes[1].uploadAndDrawGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"257x257","Texture size 257x257");
      init::textureSizes[2].uploadCallGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"257x257","Texture size 257x257");
      init::textureSizes[3].size = 0x400;
      init::textureSizes[2].uploadAndDrawGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"1024x1024","Texture size 1024x1024");
      init::textureSizes[3].uploadCallGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"1024x1024","Texture size 1024x1024");
      init::textureSizes[4].size = 0x800;
      init::textureSizes[3].uploadAndDrawGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"2048x2048","Texture size 2048x2048");
      init::textureSizes[4].uploadCallGroup = pTVar2;
      pTVar2 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar2,(this->super_TestCaseGroup).m_context,"2048x2048","Texture size 2048x2048");
      init::textureSizes[4].uploadAndDrawGroup = pTVar2;
      __cxa_guard_release(&init()::textureSizes);
    }
  }
  lVar5 = 0;
  while (lVar5 != 2) {
    paVar6 = init::uploadFunctions + lVar5;
    lVar3 = 0;
    local_d0 = lVar5;
    local_c0 = paVar6;
    while (lVar3 != 5) {
      local_e0 = init::textureSizes + lVar3;
      lVar5 = 0;
      local_c8 = lVar3;
      while( true ) {
        if (lVar5 == 0x80) break;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_e9);
        std::operator+(&local_70,&local_90,paVar6->nameLower);
        std::operator+(&local_50,&local_70,"_");
        std::operator+(&caseName,&local_50,
                       *(char **)((long)&init::textureCombinations[0].name + lVar5));
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        uploadFunction = paVar6->func;
        format = *(deUint32 *)((long)&init::textureCombinations[0].format + lVar5);
        type = *(deUint32 *)((long)&init::textureCombinations[0].type + lVar5);
        iVar1 = local_e0->size;
        pTVar2 = local_e0->uploadCallGroup;
        local_b8 = lVar5;
        node = (TestNode *)operator_new(0x130);
        TextureUploadCallCase::TextureUploadCallCase
                  ((TextureUploadCallCase *)node,(this->super_TestCaseGroup).m_context,
                   caseName._M_dataplus._M_p,"",uploadFunction,format,type,iVar1);
        tcu::TestNode::addChild((TestNode *)pTVar2,node);
        pTVar2 = local_e0->uploadAndDrawGroup;
        this_00 = (TextureUploadAndDrawCase *)operator_new(0x140);
        TextureUploadAndDrawCase::TextureUploadAndDrawCase
                  (this_00,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,"",
                   uploadFunction,format,type,iVar1);
        tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&caseName);
        lVar5 = local_b8 + 0x10;
        paVar6 = local_c0;
      }
      lVar3 = local_c8 + 1;
    }
    lVar5 = local_d0 + 1;
  }
  uVar4 = 2;
  for (lVar5 = 0; lVar5 != 0x78; lVar5 = lVar5 + 0x18) {
    tcu::TestNode::addChild
              ((TestNode *)local_e8,
               *(TestNode **)((long)&init::textureSizes[0].uploadCallGroup + lVar5));
    tcu::TestNode::addChild
              ((TestNode *)local_d8,
               *(TestNode **)((long)&init::textureSizes[0].uploadAndDrawGroup + lVar5));
    uVar4 = extraout_RAX;
  }
  return (int)uVar4;
}

Assistant:

void TextureUploadTests::init (void)
{
	TestCaseGroup* uploadCall		= new TestCaseGroup(m_context, "upload",			"Texture upload");
	TestCaseGroup* uploadAndDraw	= new TestCaseGroup(m_context, "upload_draw_swap",	"Texture upload, draw & buffer swap");

	addChild(uploadCall);
	addChild(uploadAndDraw);

	static const struct
	{
		const char*		name;
		const char*		nameLower;
		UploadFunction	func;
	} uploadFunctions[] =
	{
		{ "texImage2D",		"teximage2d",		UPLOAD_TEXIMAGE2D },
		{ "texSubImage2D",	"texsubimage2d",	UPLOAD_TEXSUBIMAGE2D }
	};

	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	type;
	} textureCombinations[] =
	{
		{ "rgb_ubyte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_ubyte",				GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "alpha_ubyte",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance_ubyte",		GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance-alpha_ubyte",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_ushort565",			GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba_ushort4444",		GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_ushort5551",		GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
	};

	static const struct
	{
		int				size;
		TestCaseGroup*	uploadCallGroup;
		TestCaseGroup*	uploadAndDrawGroup;
	} textureSizes[] =
	{
		{ 16,	new TestCaseGroup(m_context, "16x16",		"Texture size 16x16"),		new TestCaseGroup(m_context, "16x16",		"Texture size 16x16") },
		{ 256,	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256"),	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256") },
		{ 257,	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257"),	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257") },
		{ 1024,	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024"),	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024") },
		{ 2048,	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048"),	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048") },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(uploadFunc,	 uploadFunctions,
	FOR_EACH(texSize,		 textureSizes,
	FOR_EACH(texCombination, textureCombinations,
	{
		string			caseName	= string("") + uploadFunctions[uploadFunc].nameLower + "_" + textureCombinations[texCombination].name;
		UploadFunction	function	= uploadFunctions[uploadFunc].func;
		deUint32		format		= textureCombinations[texCombination].format;
		deUint32		type		= textureCombinations[texCombination].type;
		int				size		= textureSizes[texSize].size;

		textureSizes[texSize].uploadCallGroup->addChild		(new TextureUploadCallCase		(m_context, caseName.c_str(), "", function, format, type, size));
		textureSizes[texSize].uploadAndDrawGroup->addChild	(new TextureUploadAndDrawCase	(m_context, caseName.c_str(), "", function, format, type, size));
	})));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(textureSizes); i++)
	{
		uploadCall->addChild	(textureSizes[i].uploadCallGroup);
		uploadAndDraw->addChild	(textureSizes[i].uploadAndDrawGroup);
	}
}